

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsum_os_specific.c
# Opt level: O0

int XSUM_isDirectory(char *filename)

{
  int iVar1;
  int r;
  XSUM_stat_t statbuf;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  undefined4 local_88;
  undefined4 local_4;
  
  iVar1 = XSUM_stat(in_stack_ffffffffffffff60,
                    (XSUM_stat_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if ((iVar1 == 0) && ((local_88 & 0xf000) == 0x4000)) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

XSUM_API int XSUM_isDirectory(const char* filename)
{
    XSUM_stat_t statbuf;
    int r = XSUM_stat(filename, &statbuf);
#ifdef _MSC_VER
    if (!r && (statbuf.st_mode & _S_IFDIR)) return 1;
#else
    if (!r && S_ISDIR(statbuf.st_mode)) return 1;
#endif
    return 0;
}